

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.h
# Opt level: O0

void disas_set_insn_syndrome(DisasContext_conflict1 *s,uint32_t syn)

{
  uint32_t syn_local;
  DisasContext_conflict1 *s_local;
  
  if (s->insn_start != (TCGOp *)0x0) {
    tcg_set_insn_start_param(s->insn_start,2,(ulong)((syn & 0x3ffffff) >> 0xe));
    s->insn_start = (TCGOp *)0x0;
    return;
  }
  __assert_fail("s->insn_start != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate.h"
                ,0x8d,"void disas_set_insn_syndrome(DisasContext *, uint32_t)");
}

Assistant:

static inline void disas_set_insn_syndrome(DisasContext *s, uint32_t syn)
{
    /* We don't need to save all of the syndrome so we mask and shift
     * out unneeded bits to help the sleb128 encoder do a better job.
     */
    syn &= ARM_INSN_START_WORD2_MASK;
    syn >>= ARM_INSN_START_WORD2_SHIFT;

    /* We check and clear insn_start_idx to catch multiple updates.  */
    assert(s->insn_start != NULL);
    tcg_set_insn_start_param(s->insn_start, 2, syn);
    s->insn_start = NULL;
}